

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int get_str_opt(archive_write *a,archive_string *s,size_t maxsize,char *key,char *value)

{
  size_t sVar1;
  size_t local_50;
  char *value_local;
  char *key_local;
  size_t maxsize_local;
  archive_string *s_local;
  archive_write *a_local;
  
  sVar1 = strlen(value);
  if (maxsize < sVar1) {
    archive_set_error(&a->archive,-1,"Value is longer than %zu characters for option ``%s\'\'",
                      maxsize,key);
    a_local._4_4_ = -0x1e;
  }
  else {
    s->length = 0;
    if (value == (char *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = strlen(value);
    }
    archive_strncat(s,value,local_50);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
get_str_opt(struct archive_write *a, struct archive_string *s,
    size_t maxsize, const char *key, const char *value)
{

	if (strlen(value) > maxsize) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Value is longer than %zu characters "
		    "for option ``%s''", maxsize, key);
		return (ARCHIVE_FATAL);
	}
	archive_strcpy(s, value);
	return (ARCHIVE_OK);
}